

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O0

state_status_t
tchecker::zg::next(system_t *system,vloc_sptr_t *vloc,intval_sptr_t *intval,zone_sptr_t *zone,
                  vedge_sptr_t *vedge,sync_id_t *sync_id,clock_constraint_container_t *src_invariant
                  ,clock_constraint_container_t *guard,clock_reset_container_t *reset,
                  clock_constraint_container_t *tgt_invariant,semantics_t *semantics,
                  extrapolation_t *extrapolation,outgoing_edges_value_t *sync_edges)

{
  bool bVar1;
  bool bVar2;
  vloc_t *pvVar3;
  zone_t *pzVar4;
  db_t *pdVar5;
  size_t sVar6;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar7;
  clock_reset_container_t *pcVar8;
  undefined4 uVar9;
  bool tgt_delay_allowed;
  clock_id_t dim;
  db_t *dbm;
  state_status_t status;
  bool src_delay_allowed;
  sync_id_t *sync_id_local;
  vedge_sptr_t *vedge_local;
  zone_sptr_t *zone_local;
  intval_sptr_t *intval_local;
  vloc_sptr_t *vloc_local;
  system_t *system_local;
  
  pvVar3 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
            operator*(vloc)->super_vloc_t;
  bVar1 = ta::delay_allowed(system,pvVar3);
  pcVar8 = reset;
  system_local._4_4_ =
       ta::next(system,vloc,intval,vedge,sync_id,src_invariant,guard,reset,tgt_invariant,sync_edges)
  ;
  uVar9 = (undefined4)((ulong)pcVar8 >> 0x20);
  if (system_local._4_4_ == 1) {
    pzVar4 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
              ::operator->(zone)->super_zone_t;
    pdVar5 = zone_t::dbm(pzVar4);
    pzVar4 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
              ::operator->(zone)->super_zone_t;
    sVar6 = zone_t::dim(pzVar4);
    pvVar3 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
              ::operator*(vloc)->super_vloc_t;
    bVar2 = ta::delay_allowed(system,pvVar3);
    system_local._4_4_ =
         (*semantics->_vptr_semantics_t[4])
                   (semantics,pdVar5,sVar6 & 0xffffffff,(ulong)bVar1,src_invariant,guard,reset,
                    CONCAT44(uVar9,(uint)bVar2),tgt_invariant);
    if (system_local._4_4_ == 1) {
      pmVar7 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
               ::operator*(vloc);
      (*extrapolation->_vptr_extrapolation_t[2])(extrapolation,pdVar5,sVar6 & 0xffffffff,pmVar7);
      system_local._4_4_ = 1;
    }
  }
  return system_local._4_4_;
}

Assistant:

tchecker::state_status_t next(tchecker::ta::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                              tchecker::intval_sptr_t const & intval, tchecker::zg::zone_sptr_t const & zone,
                              tchecker::vedge_sptr_t const & vedge, tchecker::sync_id_t & sync_id,
                              tchecker::clock_constraint_container_t & src_invariant,
                              tchecker::clock_constraint_container_t & guard, tchecker::clock_reset_container_t & reset,
                              tchecker::clock_constraint_container_t & tgt_invariant, tchecker::zg::semantics_t & semantics,
                              tchecker::zg::extrapolation_t & extrapolation,
                              tchecker::zg::outgoing_edges_value_t const & sync_edges)
{
  bool src_delay_allowed = tchecker::ta::delay_allowed(system, *vloc);

  tchecker::state_status_t status =
      tchecker::ta::next(system, vloc, intval, vedge, sync_id, src_invariant, guard, reset, tgt_invariant, sync_edges);
  if (status != tchecker::STATE_OK)
    return status;

  tchecker::dbm::db_t * dbm = zone->dbm();
  tchecker::clock_id_t dim = zone->dim();
  bool tgt_delay_allowed = tchecker::ta::delay_allowed(system, *vloc);

  status = semantics.next(dbm, dim, src_delay_allowed, src_invariant, guard, reset, tgt_delay_allowed, tgt_invariant);
  if (status != tchecker::STATE_OK)
    return status;

  extrapolation.extrapolate(dbm, dim, *vloc);

  return tchecker::STATE_OK;
}